

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_preview.cpp
# Opt level: O3

void __thiscall QPreviewPaintEngine::QPreviewPaintEngine(QPreviewPaintEngine *this)

{
  long lVar1;
  QPaintEnginePrivate *this_00;
  
  this_00 = (QPaintEnginePrivate *)operator_new(0xe0);
  QPaintEnginePrivate::QPaintEnginePrivate(this_00);
  *(undefined ***)this_00 = &PTR__QPreviewPaintEnginePrivate_00165e68;
  *(undefined8 *)(this_00 + 0xa0) = 0;
  *(undefined8 *)(this_00 + 0xa8) = 0;
  *(undefined8 *)(this_00 + 0xb0) = 0;
  *(undefined4 *)(this_00 + 200) = 0;
  QPaintEngine::QPaintEngine(&this->super_QPaintEngine,this_00,0xfffeffff);
  *(undefined ***)this = &PTR__QPreviewPaintEngine_00165ce0;
  (this->super_QPrintEngine)._vptr_QPrintEngine = (_func_int **)&PTR__QPreviewPaintEngine_00165de0;
  lVar1 = *(long *)&this->field_0x18;
  *(undefined8 *)(lVar1 + 0xd0) = 0;
  *(undefined8 *)(lVar1 + 0xd8) = 0;
  return;
}

Assistant:

QPreviewPaintEngine::QPreviewPaintEngine()
    : QPaintEngine(*(new QPreviewPaintEnginePrivate), PaintEngineFeatures(AllFeatures & ~ObjectBoundingModeGradients))
{
    Q_D(QPreviewPaintEngine);
    d->proxy_print_engine = nullptr;
    d->proxy_paint_engine = nullptr;
}